

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks.h
# Opt level: O2

bool __thiscall
agge::tests::mocks::renderer_adapter<unsigned_short>::render_log_entry::operator==
          (render_log_entry *this,render_log_entry *rhs)

{
  bool bVar1;
  
  if (this->x == rhs->x) {
    bVar1 = std::operator==(&this->covers,&rhs->covers);
    return bVar1;
  }
  return false;
}

Assistant:

bool operator ==(const render_log_entry &rhs) const
					{	return x == rhs.x && covers == rhs.covers;	}